

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void parseVersionFromName(StringRef Name,uint *Major,uint *Minor,uint *Micro)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  uint *Components [3];
  StringRef local_48;
  uint *local_38 [3];
  
  sVar3 = Name.Length;
  local_48.Data = Name.Data;
  *Micro = 0;
  *Minor = 0;
  *Major = 0;
  lVar4 = 0;
  local_48.Length = sVar3;
  local_38[0] = Major;
  local_38[1] = Minor;
  local_38[2] = Micro;
  do {
    if ((((lVar4 == 3) || (sVar3 == 0)) ||
        (cVar1 = llvm::StringRef::operator[](&local_48,0), cVar1 < '0')) ||
       (cVar1 = llvm::StringRef::operator[](&local_48,0), '9' < cVar1)) {
      return;
    }
    if (((local_48.Length == 0) || (cVar1 = llvm::StringRef::operator[](&local_48,0), cVar1 < '0'))
       || (cVar1 = llvm::StringRef::operator[](&local_48,0), '9' < cVar1)) {
      __assert_fail("!Str.empty() && Str[0] >= \'0\' && Str[0] <= \'9\' && \"Not a number\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                    ,0x3c9,"unsigned int EatNumber(StringRef &)");
    }
    uVar2 = 0;
    do {
      cVar1 = llvm::StringRef::operator[](&local_48,0);
      uVar2 = (uVar2 * 10 + (int)cVar1) - 0x30;
      local_48.Data = local_48.Data + (local_48.Length != 0);
      sVar3 = local_48.Length - (local_48.Length != 0);
      bVar5 = local_48.Length < 2;
      local_48.Length = sVar3;
      if ((bVar5) || (cVar1 = llvm::StringRef::operator[](&local_48,0), cVar1 < '0')) break;
      cVar1 = llvm::StringRef::operator[](&local_48,0);
    } while (cVar1 < ':');
    *local_38[lVar4] = uVar2;
    if (local_48.Length == 0) {
      sVar3 = 0;
    }
    else {
      sVar3 = local_48.Length;
      if (*local_48.Data == '.') {
        local_48.Data = local_48.Data + 1;
        sVar3 = local_48.Length - 1;
        local_48.Length = sVar3;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static void parseVersionFromName(StringRef Name, unsigned &Major,
                                 unsigned &Minor, unsigned &Micro) {
  // Any unset version defaults to 0.
  Major = Minor = Micro = 0;

  // Parse up to three components.
  unsigned *Components[3] = {&Major, &Minor, &Micro};
  for (unsigned i = 0; i != 3; ++i) {
    if (Name.empty() || Name[0] < '0' || Name[0] > '9')
      break;

    // Consume the leading number.
    *Components[i] = EatNumber(Name);

    // Consume the separator, if present.
    if (Name.startswith("."))
      Name = Name.substr(1);
  }
}